

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O1

void dummy_ProfileLdSlot(void)

{
  return;
}

Assistant:

Var ProfilingHelpers::ProfiledLdLen_Jit(
        const Var instance,
        const PropertyId propertyId,
        const InlineCacheIndex inlineCacheIndex,
        const ProfileId profileId,
        void *const framePointer)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledLdLen);
        ScriptFunction * const scriptFunction = UnsafeVarTo<ScriptFunction>(JavascriptCallStackLayout::FromFramePointer(framePointer)->functionObject);
        FunctionBody * functionBody = scriptFunction->GetFunctionBody();
        DynamicProfileInfo * profileInfo = functionBody->GetDynamicProfileInfo();

        LdLenInfo ldLenInfo;
        ldLenInfo.arrayType = ValueType::Uninitialized.Merge(instance);
        profileInfo->RecordLengthLoad(functionBody, profileId, ldLenInfo);

        return
            ProfiledLdFld<false, false, false>(
                instance,
                propertyId,
                GetInlineCache(scriptFunction, inlineCacheIndex),
                inlineCacheIndex,
                scriptFunction->GetFunctionBody(),
                instance);
        JIT_HELPER_END(ProfiledLdLen);
    }